

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signpost_intrinsic_triangulation.cpp
# Opt level: O3

void __thiscall
geometrycentral::surface::SignpostIntrinsicTriangulation::resolveNewVertex
          (SignpostIntrinsicTriangulation *this,Vertex newV,SurfacePoint intrinsicPoint)

{
  SurfacePoint *pSVar1;
  double dVar2;
  undefined8 uVar3;
  pointer puVar4;
  SurfacePoint *pSVar5;
  pointer puVar6;
  unsigned_long uVar7;
  IntrinsicGeometryInterface *geom;
  Vector2 *pVVar8;
  ParentMeshT *pPVar9;
  long lVar10;
  SurfacePoint startP;
  char cVar11;
  size_t i_2;
  pointer puVar12;
  ulong uVar13;
  runtime_error *this_00;
  byte bVar14;
  size_t sVar15;
  ulong *puVar16;
  double *pdVar17;
  ulong uVar18;
  pointer puVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  int iVar23;
  int iVar24;
  size_t i_4;
  double dVar25;
  double dVar26;
  undefined1 auVar27 [16];
  Halfedge he;
  Face f;
  Halfedge he_00;
  Vector2 traceVec;
  TraceOptions options;
  TraceGeodesicResult inputTraceResult;
  TraceOptions local_160;
  double local_148;
  undefined8 uStack_140;
  double local_138;
  undefined8 uStack_130;
  double local_128;
  double dStack_120;
  undefined8 uStack_118;
  ParentMeshT *pPStack_110;
  size_t sStack_108;
  ParentMeshT *local_100;
  size_t sStack_f8;
  double dStack_f0;
  ParentMeshT *pPStack_e8;
  size_t sStack_e0;
  double dStack_d8;
  double dStack_d0;
  double dStack_c8;
  TraceGeodesicResult local_b8;
  
  sVar15 = newV.
           super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
           ind;
  he.super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.mesh =
       newV.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
       mesh;
  uVar20 = ((he.
             super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
            .mesh)->vHalfedgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start[sVar15];
  uVar13 = uVar20;
  do {
    uVar18 = uVar13;
    uVar13 = ((he.
               super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
              .mesh)->heNextArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar18];
    uVar22 = uVar18;
  } while (uVar13 != uVar20);
  do {
    he.super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.ind
         = uVar22;
    updateAngleFromCWNeighor(this,he);
    cVar11 = (he.
              super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
             .mesh)->useImplicitTwinFlag;
    if ((bool)cVar11 == true) {
      uVar22 = ((he.
                 super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                .mesh)->heNextArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar22] ^ 1;
    }
    else {
      uVar22 = ((he.
                 super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                .mesh)->heVertInNextArr).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[uVar22];
    }
  } while (uVar22 != uVar18);
  puVar19 = ((he.
              super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
             .mesh)->vHalfedgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar12 = ((he.
              super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
             .mesh)->heFaceArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start;
  uVar13 = (he.
            super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
           .mesh)->nFacesFillCount;
  uVar22 = puVar19[sVar15];
  uVar20 = uVar22;
  do {
    uVar18 = uVar20;
    if (puVar12[uVar20] < uVar13) break;
    puVar16 = ((he.
                super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
               .mesh)->heVertOutNextArr).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start + uVar20;
    if ((bool)cVar11 != false) {
      puVar16 = ((he.
                  super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                 .mesh)->heNextArr).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start + (uVar20 ^ 1);
    }
    uVar20 = *puVar16;
    uVar18 = uVar22;
  } while (uVar20 != uVar22);
  uVar20 = uVar22;
  if (uVar13 <= puVar12[uVar22]) {
    do {
      puVar16 = ((he.
                  super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                 .mesh)->heNextArr).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start + (uVar20 ^ 1);
      if ((bool)cVar11 == false) {
        puVar16 = ((he.
                    super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                   .mesh)->heVertOutNextArr).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start + uVar20;
      }
      uVar20 = *puVar16;
      if (uVar20 == uVar22) {
        uVar20 = uVar22;
        if (uVar22 == uVar18) goto LAB_001a0763;
        break;
      }
    } while (uVar13 <= puVar12[uVar20]);
  }
  do {
    f.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.ind =
         puVar12[uVar20];
    f.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.mesh =
         he.super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
         .mesh;
    updateFaceBasis(this,f);
    puVar19 = ((he.
                super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
               .mesh)->heVertOutNextArr).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start;
    puVar4 = ((he.
               super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
              .mesh)->heNextArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    cVar11 = (he.
              super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
             .mesh)->useImplicitTwinFlag;
    puVar12 = ((he.
                super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
               .mesh)->heFaceArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start;
    puVar16 = puVar19 + uVar20;
    if ((bool)cVar11 != false) {
      puVar16 = puVar4 + (uVar20 ^ 1);
    }
    uVar13 = (he.
              super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
             .mesh)->nFacesFillCount;
    uVar20 = *puVar16;
    while (uVar13 <= puVar12[uVar20]) {
      puVar16 = puVar4 + (uVar20 ^ 1);
      if ((bool)cVar11 == false) {
        puVar16 = puVar19 + uVar20;
      }
      uVar20 = *puVar16;
    }
  } while (uVar20 != uVar18);
  puVar19 = ((he.
              super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
             .mesh)->vHalfedgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar22 = puVar19[sVar15];
LAB_001a0763:
  if (cVar11 == '\0') {
    uVar20 = ((he.
               super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
              .mesh)->heSiblingArr).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start[uVar22];
  }
  else {
    uVar20 = uVar22 ^ 1;
  }
  puVar4 = ((he.
             super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
            .mesh)->heNextArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar18 = uVar22;
  do {
    uVar21 = uVar18;
    uVar18 = puVar4[uVar21];
  } while (puVar4[uVar21] != uVar22);
  pdVar17 = (this->intrinsicEdgeLengths).data.
            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  pSVar5 = (this->vertexLocations).data.
           super_PlainObjectBase<Eigen::Matrix<geometrycentral::surface::SurfacePoint,__1,_1,_0,__1,_1>_>
           .m_storage.m_data;
  puVar6 = ((he.
             super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
            .mesh)->heVertexArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  dVar26 = 0.0;
  iVar24 = 9999;
  uVar18 = uVar21;
  do {
    if (cVar11 == '\0') {
      uVar7 = ((he.
                super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
               .mesh)->heEdgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar18];
      dVar25 = pdVar17[uVar7];
      uVar7 = ((he.
                super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
               .mesh)->eHalfedgeArr).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[uVar7];
      iVar23 = 2 - (uint)(pSVar5[puVar6[uVar20]].type == Vertex);
      if (((he.
            super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
           .mesh)->heSiblingArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar7] == uVar7) goto LAB_001a0871;
    }
    else {
      dVar25 = pdVar17[uVar18 >> 1];
      iVar23 = 2 - (uint)(pSVar5[puVar6[uVar20]].type == Vertex);
      if (uVar13 <= *(ulong *)((long)puVar12 + (uVar18 * 8 | 8))) {
LAB_001a0871:
        iVar23 = 3;
      }
    }
    if ((iVar23 < iVar24) || ((iVar23 <= iVar24 && (dVar25 < dVar26)))) {
      uVar20 = uVar18;
      iVar24 = iVar23;
      dVar26 = dVar25;
    }
    if (cVar11 == '\0') {
      uVar18 = ((he.
                 super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                .mesh)->heVertInNextArr).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[uVar18];
    }
    else {
      uVar18 = puVar4[uVar18] ^ 1;
    }
  } while (uVar18 != uVar21);
  if (intrinsicPoint.type == Edge) {
    if ((intrinsicPoint.edge.
         super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.mesh)
        ->useImplicitTwinFlag == true) {
      if ((intrinsicPoint.edge.
           super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.mesh
          )->nFacesFillCount <=
          ((intrinsicPoint.edge.
            super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.
           mesh)->heFaceArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start
          [intrinsicPoint.edge.
           super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.ind
           * 2 + 1]) {
LAB_001a08f6:
        if (cVar11 == '\0') {
          uVar20 = ((he.
                     super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                    .mesh)->heSiblingArr).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar22];
        }
        else {
          uVar20 = uVar22 ^ 1;
        }
        if (cVar11 == '\0') {
          puVar12 = ((he.
                      super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                     .mesh)->heSiblingArr).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start;
          uVar13 = puVar12[puVar4[puVar12[uVar22]]];
        }
        else {
          uVar13 = puVar4[uVar22 ^ 1] ^ 1;
        }
        pPVar9 = pSVar5[puVar6[uVar20]].vertex.
                 super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
                 .mesh;
        lVar10 = *(long *)&(pPVar9->heNextArr).
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
        ;
        uVar20 = *(ulong *)(*(long *)&(pPVar9->vHalfedgeArr).
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl +
                           pSVar5[puVar6[uVar20]].vertex.
                           super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
                           .ind * 8);
        uVar22 = uVar20;
        do {
          uVar18 = uVar22;
          uVar22 = *(ulong *)(lVar10 + uVar18 * 8);
        } while (uVar22 != uVar20);
        uVar20 = uVar18;
        do {
          if (*(size_t *)
               (*(long *)&(pPVar9->heVertexArr).
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
               + uVar20 * 8) ==
              pSVar5[puVar6[uVar13]].vertex.
              super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
              .ind) {
            if (pPVar9->useImplicitTwinFlag == false) goto LAB_001a0f25;
LAB_001a0ef6:
            uVar20 = *(ulong *)(lVar10 + uVar20 * 8) ^ 1;
          }
          else {
            if (pPVar9->useImplicitTwinFlag != false) goto LAB_001a0ef6;
LAB_001a0f25:
            uVar20 = *(ulong *)(*(long *)&(pPVar9->heVertInNextArr).
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl + uVar20 * 8);
          }
          if (uVar20 == uVar18) {
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            ::std::runtime_error::runtime_error
                      (this_00,
                       "edge split problem: no boundary edge connecting vertices in boundary insertion"
                      );
            __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error
                       );
          }
        } while( true );
      }
    }
    else {
      uVar7 = ((intrinsicPoint.edge.
                super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>
               .mesh)->eHalfedgeArr).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start
              [intrinsicPoint.edge.
               super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.
               ind];
      if (((intrinsicPoint.edge.
            super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.
           mesh)->heSiblingArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar7] == uVar7) goto LAB_001a08f6;
    }
  }
  local_160.includePath = false;
  local_160.errorOnProblem = false;
  local_160.barrierEdges = (EdgeData<bool> *)0x0;
  local_160.maxIters = 0xffffffffffffffff;
  uVar7 = puVar6[uVar20];
  geom = this->inputGeom;
  pSVar1 = pSVar5 + uVar7;
  uStack_118 = *(undefined8 *)pSVar1;
  pPStack_110 = (pSVar1->vertex).
                super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
                .mesh;
  sStack_108 = (pSVar1->vertex).
               super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
               .ind;
  local_100 = (pSVar1->edge).
              super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.
              mesh;
  sStack_f8 = (pSVar1->edge).
              super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.
              ind;
  dStack_f0 = pSVar1->tEdge;
  pPStack_e8 = (pSVar1->face).
               super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.
               mesh;
  sStack_e0 = (pSVar1->face).
              super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.
              ind;
  dStack_d8 = pSVar5[uVar7].faceCoords.x;
  dStack_d0 = pSVar5[uVar7].faceCoords.y;
  dStack_c8 = pSVar5[uVar7].faceCoords.z;
  if (cVar11 == '\0') {
    uVar22 = ((he.
               super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
              .mesh)->heSiblingArr).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start[puVar19[uVar7]];
  }
  else {
    uVar22 = puVar19[uVar7] ^ 1;
  }
  dVar26 = (this->intrinsicHalfedgeDirections).data.
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[uVar20] *
           (1.0 / ((this->intrinsicVertexAngleSums).data.
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                   [uVar7] / *(double *)(&DAT_00297340 + (ulong)(puVar12[uVar22] < uVar13) * 8)));
  dVar25 = cos(dVar26);
  dVar26 = sin(dVar26);
  if ((he.super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
      mesh)->useImplicitTwinFlag == true) {
    uVar13 = uVar20 >> 1;
  }
  else {
    uVar13 = ((he.
               super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
              .mesh)->heEdgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar20];
  }
  dVar2 = (this->intrinsicEdgeLengths).data.
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[uVar13];
  startP.vertex.
  super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.mesh =
       pPStack_110;
  startP._0_8_ = uStack_118;
  startP.vertex.
  super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind =
       sStack_108;
  startP.edge.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.
  mesh = local_100;
  startP.edge.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.
  ind = sStack_f8;
  startP.tEdge = dStack_f0;
  startP.face.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.
  mesh = pPStack_e8;
  startP.face.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.
  ind = sStack_e0;
  startP.faceCoords.x = dStack_d8;
  startP.faceCoords.y = dStack_d0;
  startP.faceCoords.z = dStack_c8;
  traceVec.y = dVar26 * dVar2;
  traceVec.x = dVar2 * dVar25;
  traceGeodesic(&local_b8,geom,startP,traceVec,&local_160);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = local_b8.endPoint._0_8_;
  dVar25 = -local_b8.endingDir.y;
  dVar26 = -local_b8.endingDir.x;
  if (local_b8.pathPoints.
      super__Vector_base<geometrycentral::surface::SurfacePoint,_std::allocator<geometrycentral::surface::SurfacePoint>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    local_128 = local_b8.endPoint.faceCoords.x;
    dStack_120 = local_b8.endPoint.faceCoords.y;
    uStack_130 = 0x8000000000000000;
    uStack_140 = 0x8000000000000000;
    local_148 = -local_b8.endingDir.y;
    local_138 = -local_b8.endingDir.x;
    operator_delete(local_b8.pathPoints.
                    super__Vector_base<geometrycentral::surface::SurfacePoint,_std::allocator<geometrycentral::surface::SurfacePoint>_>
                    ._M_impl.super__Vector_impl_data._M_start);
    dVar25 = local_148;
    dVar26 = local_138;
    local_b8.endPoint.faceCoords.x = local_128;
    local_b8.endPoint.faceCoords.y = dStack_120;
  }
  pSVar5 = (this->vertexLocations).data.
           super_PlainObjectBase<Eigen::Matrix<geometrycentral::surface::SurfacePoint,__1,_1,_0,__1,_1>_>
           .m_storage.m_data;
  uVar3 = vmovlps_avx(auVar27);
  *(undefined8 *)(pSVar5 + sVar15) = uVar3;
  pSVar5[sVar15].vertex.
  super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.mesh =
       local_b8.endPoint.vertex.
       super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.mesh;
  pSVar5[sVar15].vertex.
  super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind =
       local_b8.endPoint.vertex.
       super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind;
  pSVar5[sVar15].edge.
  super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.mesh =
       local_b8.endPoint.edge.
       super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.mesh;
  pSVar5[sVar15].edge.
  super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.ind =
       local_b8.endPoint.edge.
       super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.ind;
  pSVar5[sVar15].tEdge = local_b8.endPoint.tEdge;
  pSVar5[sVar15].face.
  super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.mesh =
       local_b8.endPoint.face.
       super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.mesh;
  pSVar5[sVar15].face.
  super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.ind =
       local_b8.endPoint.face.
       super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.ind;
  pSVar5[sVar15].faceCoords.x = local_b8.endPoint.faceCoords.x;
  pSVar5[sVar15].faceCoords.y = local_b8.endPoint.faceCoords.y;
  pSVar5[sVar15].faceCoords.z = local_b8.endPoint.faceCoords.z;
  dVar26 = atan2(dVar25,dVar26);
  bVar14 = (he.
            super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
           .mesh)->useImplicitTwinFlag;
  uVar13 = ((he.
             super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
            .mesh)->vHalfedgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start[sVar15];
  if ((bool)bVar14 == true) {
    uVar13 = uVar13 ^ 1;
  }
  else {
    uVar13 = ((he.
               super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
              .mesh)->heSiblingArr).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start[uVar13];
  }
  puVar12 = ((he.
              super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
             .mesh)->heFaceArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start;
  uVar22 = (he.
            super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
           .mesh)->nFacesFillCount;
  if (puVar12[uVar13] < uVar22) {
    dVar26 = fmod(dVar26,(this->intrinsicVertexAngleSums).data.
                         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                         m_data[sVar15]);
    puVar12 = ((he.
                super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
               .mesh)->heFaceArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start;
    uVar22 = (he.
              super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
             .mesh)->nFacesFillCount;
    bVar14 = (he.
              super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
             .mesh)->useImplicitTwinFlag;
  }
  dVar26 = (double)((ulong)(puVar12[uVar20] < uVar22) * (long)dVar26);
  if ((bVar14 & 1) == 0) {
    uVar13 = ((he.
               super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
              .mesh)->heSiblingArr).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start[uVar20];
    (this->intrinsicHalfedgeDirections).data.
    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[uVar13] = dVar26
    ;
    uVar7 = ((he.
              super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
             .mesh)->heVertexArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar13];
    pdVar17 = (this->intrinsicVertexAngleSums).data.
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
              uVar7;
    uVar18 = ((he.
               super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
              .mesh)->heSiblingArr).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start
             [((he.
                super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
               .mesh)->vHalfedgeArr).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[uVar7]];
  }
  else {
    uVar13 = uVar20 ^ 1;
    (this->intrinsicHalfedgeDirections).data.
    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[uVar13] = dVar26
    ;
    uVar7 = ((he.
              super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
             .mesh)->heVertexArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar13];
    pdVar17 = (this->intrinsicVertexAngleSums).data.
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
              uVar7;
    uVar18 = ((he.
               super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
              .mesh)->vHalfedgeArr).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start[uVar7] ^ 1;
  }
  dVar26 = dVar26 * (1.0 / (*pdVar17 /
                           *(double *)(&DAT_00297340 + (ulong)(puVar12[uVar18] < uVar22) * 8)));
  dVar25 = cos(dVar26);
  dVar26 = sin(dVar26);
  if ((he.super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
      mesh)->useImplicitTwinFlag == true) {
    dVar2 = (this->intrinsicEdgeLengths).data.
            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
            [uVar13 >> 1];
    pVVar8 = (this->super_IntrinsicGeometryInterface).halfedgeVectorsInVertex.data.
             super_PlainObjectBase<Eigen::Matrix<geometrycentral::Vector2,__1,_1,_0,__1,_1>_>.
             m_storage.m_data;
    uVar20 = uVar20 ^ 1;
    pVVar8[uVar20].x = dVar2 * dVar25;
    pVVar8[uVar20].y = dVar26 * dVar2;
    puVar12 = ((he.
                super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
               .mesh)->heNextArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start;
    uVar13 = puVar12[puVar12[uVar20]] ^ 1;
  }
  else {
    puVar12 = ((he.
                super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
               .mesh)->heSiblingArr).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar20 = puVar12[uVar20];
    dVar2 = (this->intrinsicEdgeLengths).data.
            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
            [((he.
               super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
              .mesh)->heEdgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar13]];
    pVVar8 = (this->super_IntrinsicGeometryInterface).halfedgeVectorsInVertex.data.
             super_PlainObjectBase<Eigen::Matrix<geometrycentral::Vector2,__1,_1,_0,__1,_1>_>.
             m_storage.m_data;
    pVVar8[uVar20].x = dVar2 * dVar25;
    pVVar8[uVar20].y = dVar26 * dVar2;
    puVar19 = ((he.
                super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
               .mesh)->heNextArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start;
    uVar13 = puVar12[puVar19[puVar19[uVar20]]];
  }
  do {
    he_00.super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
    ind = uVar13;
    he_00.super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
    mesh = he.
           super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
           mesh;
    updateAngleFromCWNeighor(this,he_00);
    if ((he.super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
        .mesh)->nFacesFillCount <=
        ((he.
          super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
         mesh)->heFaceArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
        .super__Vector_impl_data._M_start[uVar13]) {
      return;
    }
    puVar12 = ((he.
                super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
               .mesh)->heNextArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start;
    uVar13 = puVar12[puVar12[uVar13]];
    if ((he.super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
        .mesh)->useImplicitTwinFlag == true) {
      uVar13 = uVar13 ^ 1;
    }
    else {
      uVar13 = ((he.
                 super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                .mesh)->heSiblingArr).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[uVar13];
    }
  } while (uVar13 != uVar20);
  return;
}

Assistant:

void SignpostIntrinsicTriangulation::resolveNewVertex(Vertex newV, SurfacePoint intrinsicPoint) {

  // == (1) Compute angular coordinates for the halfedges
  // Now that we have valid edge lengths, compute halfedge angular coordinates for our new vertex
  for (Halfedge heIn : newV.incomingHalfedges()) {
    updateAngleFromCWNeighor(heIn);
  }

  // == (2) Set up bases on the intrinsic faces
  for (Face f : newV.adjacentFaces()) {
    updateFaceBasis(f);
  }

  // == (3) Find the insertion point on the input mesh, use it to align tangent spaces

  // Heuristic: we have to choose some edge to trace from to resolve the vertex. Use the shortest one, as it will often
  // involve the fewest crossings. Furthermore, use an original vertex if possible to reduce accumulating numerical
  // error.
  /*
  Halfedge inputTraceHe = newV.halfedge().twin();
  double shortestTraceHeLen = intrinsicEdgeLengths[inputTraceHe.edge()];
  for (Halfedge heIn : newV.incomingHalfedges()) {
    double thisLen = intrinsicEdgeLengths[heIn.edge()];

    bool currVertIsOriginal = vertexLocations[inputTraceHe.vertex()].type == SurfacePointType::Vertex;
    bool newVertIsOriginal = vertexLocations[heIn.vertex()].type == SurfacePointType::Vertex;

    if (currVertIsOriginal && !newVertIsOriginal) continue;

    if ((newVertIsOriginal && !currVertIsOriginal) || thisLen < shortestTraceHeLen) {
      shortestTraceHeLen = thisLen;
      inputTraceHe = heIn;
    }
  }
  */


  // We have to choose some edge to trace from to resolve the vertex. Choose from neighbors according to the following
  // priority:
  //  (best)    original points
  //  (neutral) other points
  //  (worst)   boundary points
  //  [break ties by shortest edge length]
  Halfedge inputTraceHe = newV.halfedge().twin();
  std::tuple<int, double> priorityBest{9999, 0};
  for (Halfedge heIn : newV.incomingHalfedges()) {

    // length score
    double thisLen = intrinsicEdgeLengths[heIn.edge()];

    // type score
    int numScore = 2;
    SurfacePoint candidateLoc = vertexLocations[inputTraceHe.vertex()];
    if (candidateLoc.type == SurfacePointType::Vertex) {
      numScore = 1;
    }
    if (heIn.edge().isBoundary()) {
      numScore = 3;
    }

    // combined score
    std::tuple<int, double> priorityThis{numScore, thisLen};

    // keep best
    if (priorityThis < priorityBest) {
      priorityBest = priorityThis;
      inputTraceHe = heIn;
    }
  }

  // Trace from the adjacent vertex selected above to get the position/angle on the input mesh
  SurfacePoint newPositionOnInput;
  Vector2 outgoingVec;

  bool boundaryEdgeInsertion = (intrinsicPoint.type == SurfacePointType::Edge && intrinsicPoint.edge.isBoundary());
  if (boundaryEdgeInsertion) {
    // For boundary vertices, instead of tracing, directly interpolate along the edge
    inputTraceHe = newV.halfedge().twin();

    // Get t values along the edge for previous and next vertices (note that we must be along a single edge)
    double tPrev, tNext;
    Edge origEdge;

    Vertex nextV = newV.halfedge().twin().vertex();
    if (vertexLocations[nextV].type == SurfacePointType::Vertex) {
      tNext = 1.;
    } else /* SurfacePointType::Edge */ {
      tNext = vertexLocations[nextV].tEdge;
      origEdge = vertexLocations[nextV].edge;
    }

    Vertex prevV = newV.halfedge().twin().next().twin().vertex();
    if (vertexLocations[prevV].type == SurfacePointType::Vertex) {
      tPrev = 0.;
    } else /* SurfacePointType::Edge */ {
      tPrev = vertexLocations[prevV].tEdge;
      origEdge = vertexLocations[prevV].edge;
    }

    // If neither was along an edge, find the (should-be-unique) boundary edge connecting the vertices
    if (origEdge == Edge()) {
      Vertex nextVOrig = vertexLocations[nextV].vertex;
      Vertex prevVOrig = vertexLocations[prevV].vertex;

      for (Halfedge he : nextVOrig.incomingHalfedges()) {
        if (he.vertex() == prevVOrig && he.edge().isBoundary()) {
          origEdge = he.edge();
        }
      }
    }

    if (origEdge == Edge()) {
      throw std::runtime_error("edge split problem: no boundary edge connecting vertices in boundary insertion");
    }

    // Interpolate between the previous and next t values
    double localT = intrinsicPoint.tEdge;
    double thisT = (1. - localT) * tPrev + (localT)*tNext;

    newPositionOnInput = SurfacePoint(origEdge, thisT);
  } else {
    // Normal case: trace an edge inward, use the result to resolve position and tangent basis
    // std::cout << "tracing to resolve new vertex" << std::endl;
    TraceOptions options;

    TraceGeodesicResult inputTraceResult =
        traceGeodesic(inputGeom, vertexLocations[inputTraceHe.vertex()], halfedgeVector(inputTraceHe), options);
    // std::cout << " --> done tracing to resolve new vertex" << std::endl;
    // snapEndToEdgeIfClose(inputTraceResult); TODO
    newPositionOnInput = inputTraceResult.endPoint;
    outgoingVec = -inputTraceResult.endingDir;
  }


  // Set the location of our newly inserted vertex
  vertexLocations[newV] = newPositionOnInput;

  // Align the new vertex's tangent space to that of the input mesh.
  double incomingAngle = standardizeAngle(newV, outgoingVec.arg());
  if (!inputTraceHe.isInterior()) {
    incomingAngle = 0;
  }

  intrinsicHalfedgeDirections[inputTraceHe.twin()] = incomingAngle;
  // halfedgeVectorsInVertex[inputTraceHe.twin()] = outgoingVec.normalize() * intrinsicEdgeLengths[inputTraceHe.edge()];
  halfedgeVectorsInVertex[inputTraceHe.twin()] = halfedgeVector(inputTraceHe.twin());

  // Custom loop to orbit CCW from InputTraceHe
  Halfedge firstHe = inputTraceHe.twin();
  Halfedge currHe = firstHe.next().next().twin();
  do {
    updateAngleFromCWNeighor(currHe);
    if (!currHe.isInterior()) break;
    currHe = currHe.next().next().twin();
  } while (currHe != firstHe);
}